

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void * ARKStepCreate(ARKRhsFn fe,ARKRhsFn fi,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  uint uVar1;
  int iVar2;
  N_Vector y;
  SUNNonlinearSolver arkode_mem;
  sunrealtype in_RCX;
  ARKodeMem in_RDX;
  N_Vector_Ops in_RSI;
  void *in_RDI;
  int retval;
  SUNNonlinearSolver NLS;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ARKodeMem in_stack_ffffffffffffffb8;
  ARKodeMem local_8;
  
  if ((in_RDI == (void *)0x0) && (in_RSI == (N_Vector_Ops)0x0)) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x36,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Must specify at least one of fe, fi (both NULL).");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RDX == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x3e,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"y0 = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RCX == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x45,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else {
    local_8 = arkCreate((SUNContext_conflict)in_stack_ffffffffffffffb8);
    if (local_8 == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x15,0x4e,"ARKStepCreate",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"arkode_mem = NULL illegal.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      y = (N_Vector)malloc(0x200);
      if (y == (N_Vector)0x0) {
        arkProcessError(local_8,-0x14,0x58,"ARKStepCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"Allocation of arkode_mem failed.");
        ARKodeFree((void **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        local_8 = (ARKodeMem)0x0;
      }
      else {
        memset(y,0,0x200);
        local_8->step_attachlinsol = arkStep_AttachLinsol;
        local_8->step_attachmasssol = arkStep_AttachMasssol;
        local_8->step_disablelsetup = arkStep_DisableLSetup;
        local_8->step_disablemsetup = arkStep_DisableMSetup;
        local_8->step_getlinmem = arkStep_GetLmem;
        local_8->step_getmassmem = arkStep_GetMassMem;
        local_8->step_getimplicitrhs = arkStep_GetImplicitRHS;
        local_8->step_mmult = (ARKMassMultFn)0x0;
        local_8->step_getgammas = arkStep_GetGammas;
        local_8->step_init = arkStep_Init;
        local_8->step_fullrhs = arkStep_FullRHS;
        local_8->step = arkStep_TakeStep_Z;
        local_8->step_setuserdata = arkStep_SetUserData;
        local_8->step_printallstats = arkStep_PrintAllStats;
        local_8->step_writeparameters = arkStep_WriteParameters;
        local_8->step_resize = arkStep_Resize;
        local_8->step_free = arkStep_Free;
        local_8->step_printmem = arkStep_PrintMem;
        local_8->step_setdefaults = arkStep_SetDefaults;
        local_8->step_computestate = arkStep_ComputeState;
        local_8->step_setrelaxfn = arkStep_SetRelaxFn;
        local_8->step_setorder = arkStep_SetOrder;
        local_8->step_setnonlinearsolver = arkStep_SetNonlinearSolver;
        local_8->step_setlinear = arkStep_SetLinear;
        local_8->step_setnonlinear = arkStep_SetNonlinear;
        local_8->step_setautonomous = arkStep_SetAutonomous;
        local_8->step_setnlsrhsfn = arkStep_SetNlsRhsFn;
        local_8->step_setdeduceimplicitrhs = arkStep_SetDeduceImplicitRhs;
        local_8->step_setnonlincrdown = arkStep_SetNonlinCRDown;
        local_8->step_setnonlinrdiv = arkStep_SetNonlinRDiv;
        local_8->step_setdeltagammamax = arkStep_SetDeltaGammaMax;
        local_8->step_setlsetupfrequency = arkStep_SetLSetupFrequency;
        local_8->step_setpredictormethod = arkStep_SetPredictorMethod;
        local_8->step_setmaxnonliniters = arkStep_SetMaxNonlinIters;
        local_8->step_setnonlinconvcoef = arkStep_SetNonlinConvCoef;
        local_8->step_setstagepredictfn = arkStep_SetStagePredictFn;
        local_8->step_getnumrhsevals = arkStep_GetNumRhsEvals;
        local_8->step_getnumlinsolvsetups = arkStep_GetNumLinSolvSetups;
        local_8->step_getcurrentgamma = arkStep_GetCurrentGamma;
        local_8->step_getestlocalerrors = arkStep_GetEstLocalErrors;
        local_8->step_getnonlinearsystemdata = arkStep_GetNonlinearSystemData;
        local_8->step_getnumnonlinsolviters = arkStep_GetNumNonlinSolvIters;
        local_8->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
        local_8->step_getnonlinsolvstats = arkStep_GetNonlinSolvStats;
        local_8->step_setforcing = arkStep_SetInnerForcing;
        local_8->step_supports_adaptive = 1;
        local_8->step_supports_implicit = 1;
        local_8->step_supports_massmatrix = 1;
        local_8->step_supports_relaxation = 1;
        local_8->step_mem = y;
        uVar1 = arkStep_SetDefaults(local_8);
        if (uVar1 == 0) {
          *(uint *)((long)&y[1].content + 4) = (uint)(in_RDI != (void *)0x0);
          *(uint *)&y[1].ops = (uint)(in_RSI != (N_Vector_Ops)0x0);
          iVar2 = arkAllocVec(in_stack_ffffffffffffffb8,(N_Vector)(ulong)in_stack_ffffffffffffffb0,
                              in_stack_ffffffffffffffa8);
          if (iVar2 == 0) {
            ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
            local_8 = (ARKodeMem)0x0;
          }
          else {
            iVar2 = arkAllocVec(in_stack_ffffffffffffffb8,
                                (N_Vector)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
            if (iVar2 == 0) {
              ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
              local_8 = (ARKodeMem)0x0;
            }
            else {
              iVar2 = arkAllocVec(in_stack_ffffffffffffffb8,
                                  (N_Vector)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffa8);
              if (iVar2 == 0) {
                ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
                local_8 = (ARKodeMem)0x0;
              }
              else {
                y->content = in_RDI;
                y->ops = in_RSI;
                local_8->liw = local_8->liw + 0x29;
                local_8->lrw = local_8->lrw + 10;
                *(undefined4 *)&y[6].content = 0;
                if (*(int *)&y[1].ops != 0) {
                  arkode_mem = SUNNonlinSol_Newton(y,(SUNContext_conflict)in_stack_ffffffffffffffb8)
                  ;
                  if (arkode_mem == (SUNNonlinearSolver)0x0) {
                    arkProcessError(local_8,-0x14,0xc5,"ARKStepCreate",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                    ,"Error creating default Newton solver");
                    ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
                    return (void *)0x0;
                  }
                  iVar2 = ARKodeSetNonlinearSolver
                                    (arkode_mem,
                                     (SUNNonlinearSolver)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
                  if (iVar2 != 0) {
                    arkProcessError(local_8,-0x14,0xcd,"ARKStepCreate",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                    ,"Error attaching default Newton solver");
                    ARKodeFree((void **)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
                    return (void *)0x0;
                  }
                  *(undefined4 *)&y[6].content = 1;
                }
                y[0xc].content = (void *)0x0;
                y[0xc].ops = (N_Vector_Ops)0x0;
                y[0xc].sunctx = (SUNContext_conflict)0x0;
                y[0xd].content = (void *)0x0;
                y[0xd].ops = (N_Vector_Ops)0x0;
                *(undefined4 *)&y[0xd].sunctx = 0xffffffff;
                y[0xe].content = (void *)0x0;
                y[0xe].ops = (N_Vector_Ops)0x0;
                y[0xe].sunctx = (SUNContext_conflict)0x0;
                y[0xf].content = (void *)0x0;
                y[0xf].ops = (N_Vector_Ops)0x0;
                y[0xf].sunctx = (SUNContext_conflict)0x0;
                *(undefined4 *)&y[0x10].content = 0;
                *(undefined4 *)((long)&y[0x10].content + 4) = 0xffffffff;
                y[9].sunctx = (SUNContext_conflict)&DAT_3ff0000000000000;
                y[0x10].ops = (N_Vector_Ops)0x0;
                y[0x10].sunctx = (SUNContext_conflict)0x0;
                y[0x11].content = (void *)0x0;
                y[10].sunctx = (SUNContext_conflict)0x0;
                y[0x11].ops = (N_Vector_Ops)0x0;
                y[0x11].sunctx = (SUNContext_conflict)0x0;
                y[0x12].content = (void *)0x0;
                y[0x12].ops = (N_Vector_Ops)0x0;
                *(undefined4 *)&y[0x12].sunctx = 0;
                *(undefined4 *)((long)&y[0x12].sunctx + 4) = 0;
                *(undefined4 *)&y[0x13].content = 0;
                y[0x14].content = (void *)0x0;
                *(undefined4 *)&y[0x14].ops = 0;
                y[0xb].sunctx = (SUNContext_conflict)0x0;
                uVar1 = arkInit(in_RDX,in_RCX,(N_Vector)local_8,(int)((ulong)y >> 0x20));
                if (uVar1 != 0) {
                  arkProcessError(local_8,(int)(ulong)uVar1,0x104,"ARKStepCreate",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                  ,"Unable to initialize main ARKODE infrastructure");
                  ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
                  local_8 = (ARKodeMem)0x0;
                }
              }
            }
          }
        }
        else {
          arkProcessError(local_8,(int)(ulong)uVar1,0x97,"ARKStepCreate",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Error setting default solver options");
          ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
          local_8 = (ARKodeMem)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* ARKStepCreate(ARKRhsFn fe, ARKRhsFn fi, sunrealtype t0, N_Vector y0,
                    SUNContext sunctx)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* Check that at least one of fe, fi is supplied and is to be used */
  if (fe == NULL && fi == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeARKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeARKStepMem)malloc(sizeof(struct ARKodeARKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeARKStepMemRec));

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_attachlinsol              = arkStep_AttachLinsol;
  ark_mem->step_attachmasssol             = arkStep_AttachMasssol;
  ark_mem->step_disablelsetup             = arkStep_DisableLSetup;
  ark_mem->step_disablemsetup             = arkStep_DisableMSetup;
  ark_mem->step_getlinmem                 = arkStep_GetLmem;
  ark_mem->step_getmassmem                = arkStep_GetMassMem;
  ark_mem->step_getimplicitrhs            = arkStep_GetImplicitRHS;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = arkStep_GetGammas;
  ark_mem->step_init                      = arkStep_Init;
  ark_mem->step_fullrhs                   = arkStep_FullRHS;
  ark_mem->step                           = arkStep_TakeStep_Z;
  ark_mem->step_setuserdata               = arkStep_SetUserData;
  ark_mem->step_printallstats             = arkStep_PrintAllStats;
  ark_mem->step_writeparameters           = arkStep_WriteParameters;
  ark_mem->step_resize                    = arkStep_Resize;
  ark_mem->step_free                      = arkStep_Free;
  ark_mem->step_printmem                  = arkStep_PrintMem;
  ark_mem->step_setdefaults               = arkStep_SetDefaults;
  ark_mem->step_computestate              = arkStep_ComputeState;
  ark_mem->step_setrelaxfn                = arkStep_SetRelaxFn;
  ark_mem->step_setorder                  = arkStep_SetOrder;
  ark_mem->step_setnonlinearsolver        = arkStep_SetNonlinearSolver;
  ark_mem->step_setlinear                 = arkStep_SetLinear;
  ark_mem->step_setnonlinear              = arkStep_SetNonlinear;
  ark_mem->step_setautonomous             = arkStep_SetAutonomous;
  ark_mem->step_setnlsrhsfn               = arkStep_SetNlsRhsFn;
  ark_mem->step_setdeduceimplicitrhs      = arkStep_SetDeduceImplicitRhs;
  ark_mem->step_setnonlincrdown           = arkStep_SetNonlinCRDown;
  ark_mem->step_setnonlinrdiv             = arkStep_SetNonlinRDiv;
  ark_mem->step_setdeltagammamax          = arkStep_SetDeltaGammaMax;
  ark_mem->step_setlsetupfrequency        = arkStep_SetLSetupFrequency;
  ark_mem->step_setpredictormethod        = arkStep_SetPredictorMethod;
  ark_mem->step_setmaxnonliniters         = arkStep_SetMaxNonlinIters;
  ark_mem->step_setnonlinconvcoef         = arkStep_SetNonlinConvCoef;
  ark_mem->step_setstagepredictfn         = arkStep_SetStagePredictFn;
  ark_mem->step_getnumrhsevals            = arkStep_GetNumRhsEvals;
  ark_mem->step_getnumlinsolvsetups       = arkStep_GetNumLinSolvSetups;
  ark_mem->step_getcurrentgamma           = arkStep_GetCurrentGamma;
  ark_mem->step_getestlocalerrors         = arkStep_GetEstLocalErrors;
  ark_mem->step_getnonlinearsystemdata    = arkStep_GetNonlinearSystemData;
  ark_mem->step_getnumnonlinsolviters     = arkStep_GetNumNonlinSolvIters;
  ark_mem->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
  ark_mem->step_getnonlinsolvstats        = arkStep_GetNonlinSolvStats;
  ark_mem->step_setforcing                = arkStep_SetInnerForcing;
  ark_mem->step_supports_adaptive         = SUNTRUE;
  ark_mem->step_supports_implicit         = SUNTRUE;
  ark_mem->step_supports_massmatrix       = SUNTRUE;
  ark_mem->step_supports_relaxation       = SUNTRUE;
  ark_mem->step_mem                       = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = arkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit = (fe == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit = (fi == NULL) ? SUNFALSE : SUNTRUE;

  /* Allocate the general ARK stepper vectors using y0 as a template */
  /* NOTE: Fe, Fi, cvals and Xvecs will be allocated later on
     (based on the number of ARK stages) */

  /* Clone the input vector to create sdata, zpred and zcor */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zpred)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zcor)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = fe;
  step_mem->fi = fi;

  /* Update the ARKODE workspace requirements */
  ark_mem->liw += 41; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */
  ark_mem->lrw += 10;

  /* If an implicit component is to be solved, create default Newton NLS object */
  step_mem->ownNLS = SUNFALSE;
  if (step_mem->implicit)
  {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Set the linear solver addresses to NULL (we check != NULL later) */
  step_mem->linit       = NULL;
  step_mem->lsetup      = NULL;
  step_mem->lsolve      = NULL;
  step_mem->lfree       = NULL;
  step_mem->lmem        = NULL;
  step_mem->lsolve_type = -1;

  /* Set the mass matrix solver addresses to NULL */
  step_mem->minit       = NULL;
  step_mem->msetup      = NULL;
  step_mem->mmult       = NULL;
  step_mem->msolve      = NULL;
  step_mem->mfree       = NULL;
  step_mem->mass_mem    = NULL;
  step_mem->mass_type   = MASS_IDENTITY;
  step_mem->msolve_type = -1;

  /* Initialize initial error norm  */
  step_mem->eRNrm = ONE;

  /* Initialize all the counters */
  step_mem->nfe       = 0;
  step_mem->nfi       = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* Initialize fused op work space */
  step_mem->cvals        = NULL;
  step_mem->Xvecs        = NULL;
  step_mem->nfusedopvecs = 0;

  /* Initialize external polynomial forcing data */
  step_mem->expforcing = SUNFALSE;
  step_mem->impforcing = SUNFALSE;
  step_mem->forcing    = NULL;
  step_mem->nforcing   = 0;

  /* Initialize saved fi alias */
  step_mem->fn_implicit = NULL;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}